

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O1

int sys_open(char *path,int oflag,...)

{
  int iVar1;
  char *pcVar2;
  char cVar3;
  ulong in_RDX;
  char *pcVar4;
  va_list ap;
  char pathbuf [1000];
  char local_3e8 [1000];
  
  cVar3 = *path;
  if (cVar3 == '\0') {
    pcVar2 = local_3e8;
  }
  else {
    pcVar4 = path + 1;
    pcVar2 = local_3e8;
    do {
      *pcVar2 = cVar3;
      pcVar2 = pcVar2 + 1;
      cVar3 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar3 != '\0');
  }
  *pcVar2 = '\0';
  if ((oflag & 0x40U) == 0) {
    iVar1 = open(local_3e8,oflag);
  }
  else {
    iVar1 = open(local_3e8,oflag,in_RDX & 0xffffffff);
  }
  return iVar1;
}

Assistant:

int sys_open(const char *path, int oflag, ...)
{
    int i, fd;
    char pathbuf[MAXPDSTRING];
    sys_bashfilename(path, pathbuf);
    if (oflag & O_CREAT)
    {
        mode_t mode;
        int imode;
        va_list ap;
        va_start(ap, oflag);

        /* Mac compiler complains if we just set mode = va_arg ... so, even
        though we all know it's just an int, we explicitly va_arg to an int
        and then convert.
           -> http://www.mail-archive.com/bug-gnulib@gnu.org/msg14212.html
           -> http://bugs.debian.org/647345
        */

        imode = va_arg (ap, int);
        mode = (mode_t)imode;
        va_end(ap);
        fd = open(pathbuf, oflag, mode);
    }
    else
        fd = open(pathbuf, oflag);
    return fd;
}